

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

int katherine_set_acq_mode
              (katherine_device_t *device,katherine_acquisition_mode_t acq_mode,
              _Bool fast_vco_enabled)

{
  int iVar1;
  char ack [8];
  undefined8 local_30;
  undefined1 local_28 [8];
  
  iVar1 = katherine_udp_mutex_lock(&device->control_socket);
  if (iVar1 == 0) {
    local_30 = CONCAT71(0x90000000000,fast_vco_enabled << 7 | (byte)acq_mode);
    iVar1 = katherine_udp_send_exact(&device->control_socket,&local_30,8);
    if (iVar1 == 0) {
      iVar1 = katherine_udp_recv_exact(&device->control_socket,local_28,8);
    }
  }
  katherine_udp_mutex_unlock(&device->control_socket);
  return iVar1;
}

Assistant:

int
katherine_set_acq_mode(katherine_device_t *device, katherine_acquisition_mode_t acq_mode, bool fast_vco_enabled)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    char cmd[8] = {0};
    cmd[6] = CMD_TYPE_ACQUISITION_MODE_SETTING;

    cmd[0] |= acq_mode;
    cmd[0] |= fast_vco_enabled << 7;

    res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}